

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd.c
# Opt level: O1

void gdImageDestroy(gdImagePtr im)

{
  long lVar1;
  
  if (im->pixels != (uchar **)0x0) {
    if (0 < im->sy) {
      lVar1 = 0;
      do {
        gdFree(im->pixels[lVar1]);
        lVar1 = lVar1 + 1;
      } while (lVar1 < im->sy);
    }
    gdFree(im->pixels);
  }
  if (im->tpixels != (int **)0x0) {
    if (0 < im->sy) {
      lVar1 = 0;
      do {
        gdFree(im->tpixels[lVar1]);
        lVar1 = lVar1 + 1;
      } while (lVar1 < im->sy);
    }
    gdFree(im->tpixels);
  }
  if (im->polyInts != (int *)0x0) {
    gdFree(im->polyInts);
  }
  if (im->style != (int *)0x0) {
    gdFree(im->style);
  }
  gdFree(im);
  return;
}

Assistant:

BGD_DECLARE(void) gdImageDestroy (gdImagePtr im)
{
	int i;
	if (im->pixels) {
		for (i = 0; (i < im->sy); i++) {
			gdFree (im->pixels[i]);
		}
		gdFree (im->pixels);
	}
	if (im->tpixels) {
		for (i = 0; (i < im->sy); i++) {
			gdFree (im->tpixels[i]);
		}
		gdFree (im->tpixels);
	}
	if (im->polyInts) {
		gdFree (im->polyInts);
	}
	if (im->style) {
		gdFree (im->style);
	}
	gdFree (im);
}